

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock.cc
# Opt level: O1

Time absl::lts_20250127::Now(void)

{
  ulong uVar1;
  HiRep HVar2;
  uint32_t uVar3;
  long lVar4;
  Time TVar5;
  
  uVar1 = GetCurrentTimeNanos();
  if ((long)uVar1 < 0) {
    lVar4 = (long)uVar1 % 1000000000;
    HVar2 = (HiRep)((lVar4 >> 0x3d) + (long)uVar1 / 1000000000);
    uVar3 = (int)lVar4 * 4 + 4000000000;
    if (-1 < lVar4) {
      uVar3 = (int)lVar4 * 4;
    }
  }
  else {
    HVar2 = (HiRep)(uVar1 / 1000000000);
    uVar3 = ((int)uVar1 + HVar2.lo_ * -1000000000) * 4;
  }
  TVar5.rep_.rep_lo_ = uVar3;
  TVar5.rep_.rep_hi_ = HVar2;
  return (Time)TVar5.rep_;
}

Assistant:

ABSL_NAMESPACE_BEGIN
Time Now() {
  // TODO(bww): Get a timespec instead so we don't have to divide.
  int64_t n = absl::GetCurrentTimeNanos();
  if (n >= 0) {
    return time_internal::FromUnixDuration(
        time_internal::MakeDuration(n / 1000000000, n % 1000000000 * 4));
  }
  return time_internal::FromUnixDuration(absl::Nanoseconds(n));
}